

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

void __thiscall
Js::ConcatStringBuilder::ConcatStringBuilder(ConcatStringBuilder *this,ConcatStringBuilder *other)

{
  Type TVar1;
  charcount_t newLength;
  StaticType *stringType;
  
  stringType = StringCache::GetStringTypeStatic
                         (&((((((((other->super_ConcatStringBase).super_LiteralString.
                                  super_JavascriptString.super_RecyclableObject.type.ptr)->
                                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                             ptr)->super_ScriptContextBase).javascriptLibrary)->stringCache);
  ConcatStringBase::ConcatStringBase(&this->super_ConcatStringBase,stringType);
  (this->super_ConcatStringBase).super_LiteralString.super_JavascriptString.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0138f7c8;
  (this->m_slots).ptr = (WriteBarrierPtr<Js::JavascriptString> *)0x0;
  (this->m_prevChunk).ptr = (ConcatStringBuilder *)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::JavascriptString>_>::operator=
            (&this->m_slots,&other->m_slots);
  TVar1 = other->m_count;
  this->m_slotCount = other->m_slotCount;
  this->m_count = TVar1;
  Memory::WriteBarrierPtr<Js::ConcatStringBuilder>::operator=
            (&this->m_prevChunk,&other->m_prevChunk);
  newLength = JavascriptString::GetLength((JavascriptString *)other);
  JavascriptString::SetLength((JavascriptString *)this,newLength);
  return;
}

Assistant:

ConcatStringBuilder::ConcatStringBuilder(const ConcatStringBuilder& other):
        ConcatStringBase(other.GetScriptContext()->GetLibrary()->GetStringTypeStatic())
    {
        m_slots = other.m_slots;
        m_count = other.m_count;
        m_slotCount = other.m_slotCount;
        m_prevChunk = other.m_prevChunk;
        this->SetLength(other.GetLength());
        // TODO: should we copy the JavascriptString buffer and if so, how do we pass over the ownership?
    }